

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.hpp
# Opt level: O2

void __thiscall
glu::TextureTestUtil::ReferenceParams::ReferenceParams
          (ReferenceParams *this,TextureType texType_,Sampler *sampler_,LodMode lodMode_)

{
  undefined8 uVar1;
  undefined8 uVar2;
  bool bVar3;
  undefined3 uVar4;
  DepthStencilMode DVar5;
  FilterMode FVar6;
  float fVar7;
  bool bVar8;
  undefined3 uVar9;
  CompareMode CVar10;
  WrapMode WVar11;
  WrapMode WVar12;
  WrapMode WVar13;
  FilterMode FVar14;
  
  RenderParams::RenderParams(&this->super_RenderParams,texType_);
  WVar11 = sampler_->wrapS;
  WVar12 = sampler_->wrapT;
  WVar13 = sampler_->wrapR;
  FVar14 = sampler_->minFilter;
  FVar6 = sampler_->magFilter;
  fVar7 = sampler_->lodThreshold;
  bVar8 = sampler_->normalizedCoords;
  uVar9 = *(undefined3 *)&sampler_->field_0x19;
  CVar10 = sampler_->compare;
  uVar1 = *(undefined8 *)&sampler_->compareChannel;
  uVar2 = *(undefined8 *)((long)&(sampler_->borderColor).v + 4);
  bVar3 = sampler_->seamlessCubeMap;
  uVar4 = *(undefined3 *)&sampler_->field_0x35;
  DVar5 = sampler_->depthStencilMode;
  *(undefined8 *)((long)&(this->sampler).borderColor.v + 8) =
       *(undefined8 *)((long)&(sampler_->borderColor).v + 8);
  (this->sampler).seamlessCubeMap = bVar3;
  *(undefined3 *)&(this->sampler).field_0x35 = uVar4;
  (this->sampler).depthStencilMode = DVar5;
  *(undefined8 *)&(this->sampler).compareChannel = uVar1;
  *(undefined8 *)((long)&(this->sampler).borderColor.v + 4) = uVar2;
  (this->sampler).magFilter = FVar6;
  (this->sampler).lodThreshold = fVar7;
  (this->sampler).normalizedCoords = bVar8;
  *(undefined3 *)&(this->sampler).field_0x19 = uVar9;
  (this->sampler).compare = CVar10;
  (this->sampler).wrapS = WVar11;
  (this->sampler).wrapT = WVar12;
  (this->sampler).wrapR = WVar13;
  (this->sampler).minFilter = FVar14;
  this->lodMode = lodMode_;
  this->minLod = -1000.0;
  this->maxLod = 1000.0;
  this->baseLevel = 0;
  this->maxLevel = 1000;
  return;
}

Assistant:

ReferenceParams (TextureType texType_, const tcu::Sampler& sampler_, LodMode lodMode_ = LODMODE_EXACT)
		: RenderParams	(texType_)
		, sampler		(sampler_)
		, lodMode		(lodMode_)
		, minLod		(-1000.0f)
		, maxLod		(1000.0f)
		, baseLevel		(0)
		, maxLevel		(1000)
	{
	}